

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator_nginx.c
# Opt level: O0

memory_allocator
memory_allocator_nginx
          (void *pool,memory_allocator_nginx_impl_palloc palloc,
          memory_allocator_nginx_impl_pcopy pcopy,memory_allocator_nginx_impl_pfree pfree)

{
  memory_allocator pmVar1;
  memory_allocator_iface in_RSI;
  void *in_RDI;
  memory_allocator_nginx_ctx_type nginx_ctx;
  
  memory_allocator_nginx_iface();
  pmVar1 = memory_allocator_create(in_RSI,in_RDI);
  return pmVar1;
}

Assistant:

memory_allocator memory_allocator_nginx(void *pool, memory_allocator_nginx_impl_palloc palloc, memory_allocator_nginx_impl_pcopy pcopy, memory_allocator_nginx_impl_pfree pfree)
{
	struct memory_allocator_nginx_ctx_type nginx_ctx;

	nginx_ctx.pool = pool;
	nginx_ctx.palloc = palloc;
	nginx_ctx.pcopy = pcopy;
	nginx_ctx.pfree = pfree;

	return memory_allocator_create(memory_allocator_nginx_iface(), &nginx_ctx);
}